

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_wc.cpp
# Opt level: O0

bool __thiscall CmdWc::Execute(CmdWc *this)

{
  bool bVar1;
  byte bVar2;
  FileType FVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pbVar6;
  char *pcVar7;
  string local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  undefined1 local_2d8 [8];
  ifstream fin;
  string local_d0 [48];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [36];
  int local_5c;
  iterator iStack_58;
  int t;
  _Self local_50;
  iterator i_1;
  int local_40;
  int lineTotal;
  int wordTotal;
  int byteTotal;
  _Self local_30;
  _Self local_28;
  iterator i;
  bool lineActive;
  bool wordActive;
  bool byteActive;
  CmdWc *this_local;
  
  sVar4 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_Command).parameter);
  if (sVar4 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"error");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    i._M_node._7_1_ = 0;
    i._M_node._6_1_ = 0;
    i._M_node._5_1_ = 0;
    sVar4 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_Command).option);
    if (sVar4 == 0) {
      i._M_node._5_1_ = 1;
      i._M_node._6_1_ = 1;
      i._M_node._7_1_ = 1;
    }
    else {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&(this->super_Command).option);
      while( true ) {
        local_30._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&(this->super_Command).option);
        bVar1 = std::operator!=(&local_28,&local_30);
        if (!bVar1) break;
        pbVar6 = std::
                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_28);
        bVar1 = std::operator==(pbVar6,"-c");
        if (bVar1) {
          i._M_node._7_1_ = 1;
        }
        else {
          pbVar6 = std::
                   _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_28);
          bVar1 = std::operator==(pbVar6,"-w");
          if (bVar1) {
            i._M_node._6_1_ = 1;
          }
          else {
            pbVar6 = std::
                     _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
            bVar1 = std::operator==(pbVar6,"-l");
            if (!bVar1) {
              poVar5 = std::operator<<((ostream *)&std::cout,"wc: invalid option -- \'");
              pbVar6 = std::
                       _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_28);
              poVar5 = std::operator<<(poVar5,(string *)pbVar6);
              poVar5 = std::operator<<(poVar5,"\'");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              return false;
            }
            i._M_node._5_1_ = 1;
          }
        }
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_28,0);
      }
    }
    lineTotal = 0;
    local_40 = 0;
    i_1._M_node._4_4_ = 0;
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&(this->super_Command).parameter);
    while( true ) {
      iStack_58 = std::__cxx11::
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&(this->super_Command).parameter);
      bVar1 = std::operator!=(&local_50,&stack0xffffffffffffffa8);
      if (!bVar1) break;
      pbVar6 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      FVar3 = DirUtils::GetFileType(pbVar6);
      if (FVar3 == DU_DIRECTORY) {
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::operator+((char *)local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"wc: ");
        std::operator+(local_80,(char *)local_a0);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_80);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_80);
        std::__cxx11::string::~string(local_a0);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::operator+((char *)local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"0 0 0 "
                      );
        poVar5 = std::operator<<((ostream *)&std::cout,local_d0);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_d0);
      }
      else {
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream(local_2d8,pcVar7,_S_bin);
        bVar2 = std::ifstream::is_open();
        if ((bVar2 & 1) == 0) {
          std::
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_50);
          std::operator+((char *)local_318,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"wc: "
                        );
          std::operator+(local_2f8,(char *)local_318);
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_2f8);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_2f8);
          std::__cxx11::string::~string(local_318);
        }
        else {
          if ((i._M_node._5_1_ & 1) != 0) {
            pbVar6 = std::
                     _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_50);
            local_5c = CntLine(this,pbVar6);
            i_1._M_node._4_4_ = i_1._M_node._4_4_ + local_5c;
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5c);
            std::operator<<(poVar5,' ');
          }
          if ((i._M_node._6_1_ & 1) != 0) {
            pbVar6 = std::
                     _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_50);
            local_5c = CntWord(this,pbVar6);
            local_40 = local_40 + local_5c;
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5c);
            std::operator<<(poVar5,' ');
          }
          if ((i._M_node._7_1_ & 1) != 0) {
            pbVar6 = std::
                     _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_50);
            local_5c = CntByte(this,pbVar6);
            lineTotal = lineTotal + local_5c;
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5c);
            std::operator<<(poVar5,' ');
          }
          pbVar6 = std::
                   _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_50);
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)pbVar6);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        std::ifstream::~ifstream(local_2d8);
      }
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_50,0);
    }
    sVar4 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_Command).parameter);
    if (1 < sVar4) {
      if ((i._M_node._5_1_ & 1) != 0) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i_1._M_node._4_4_);
        std::operator<<(poVar5,' ');
      }
      if ((i._M_node._6_1_ & 1) != 0) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_40);
        std::operator<<(poVar5,' ');
      }
      if ((i._M_node._7_1_ & 1) != 0) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,lineTotal);
        std::operator<<(poVar5,' ');
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"total");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdWc::Execute(){
	if(parameter.size() == 0){
		cout << "error" << endl;
		return false;
	}
	bool byteActive = false, wordActive = false, lineActive = false;
	if(option.size() == 0){
		byteActive = wordActive = lineActive = true;
	}
	else{
		for(auto i = option.begin(); i != option.end(); i++){
			if((*i) == "-c")byteActive = true;
			else if((*i) == "-w")wordActive = true;
			else if((*i) == "-l")lineActive = true;
			else{
				cout << "wc: invalid option -- '" << (*i) << "'" << endl;	
				return false;
			}
		}
	}
	
	int byteTotal = 0, wordTotal = 0, lineTotal = 0;
	for(auto i = parameter.begin(); i != parameter.end(); i++){
		int t;
		if(GetFileType(*i) == DU_DIRECTORY){
			cout << "wc: " + (*i) + ": Is a directory" << endl;
			cout << "0 0 0 " + (*i) << endl;
			continue;
		}
		ifstream fin((*i).c_str(), ios::binary);
		if(!fin.is_open()){
			cout << "wc: " + (*i) + ": No such file or directory" << endl;
			continue;
		}
		else{
			if(lineActive){
				t = CntLine(*i);
				lineTotal += t;
				cout << t << ' ';
			}
			if(wordActive){
				t = CntWord(*i);
				wordTotal += t;
				cout << t << ' ';
			}
			if(byteActive){
				t = CntByte(*i);
				byteTotal += t;
				cout << t << ' ';
			}
			cout << (*i) << endl;
		}
	}

	if(parameter.size() > 1){
		if(lineActive)cout << lineTotal << ' ';
		if(wordActive)cout << wordTotal << ' ';
		if(byteActive)cout << byteTotal << ' ';
		cout << "total" << endl;
	}
	return true;
}